

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web.cpp
# Opt level: O1

Am_Constraint * __thiscall Am_Web::operator_cast_to_Am_Constraint_(Am_Web *this)

{
  Am_Web_Validate_Proc *pAVar1;
  Am_Web_Create_Proc *pAVar2;
  Am_Web_Initialize_Proc *pAVar3;
  undefined8 *puVar4;
  
  puVar4 = (undefined8 *)operator_new(0x70);
  pAVar2 = this->create;
  pAVar3 = this->initialize;
  pAVar1 = this->validate;
  puVar4[0xb] = &PTR_ID_002e3860;
  puVar4[0xc] = puVar4;
  *puVar4 = pAVar2;
  puVar4[1] = pAVar3;
  puVar4[2] = pAVar1;
  *(undefined1 *)((long)puVar4 + 0x6a) = 0;
  *(undefined2 *)(puVar4 + 0xd) = 0;
  puVar4[9] = 0;
  puVar4[10] = 0;
  puVar4[7] = 0;
  puVar4[8] = 0;
  puVar4[5] = 0;
  puVar4[6] = 0;
  puVar4[3] = 0;
  puVar4[4] = 0;
  return (Am_Constraint *)(puVar4 + 0xb);
}

Assistant:

Am_Web::operator Am_Constraint *()
{
  Am_Web_Data *data = new Am_Web_Data(create, initialize, validate);
  return *data;
}